

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

double bsc_bcast_2phase_costs(bsc_group_t group,bsc_coll_params_t *set,bsc_size_t n)

{
  double dVar1;
  int local_3c;
  double local_38;
  double one_phase;
  bsc_pid_t P;
  group_t *g;
  bsc_size_t i;
  bsc_size_t n_local;
  bsc_coll_params_t *set_local;
  bsc_group_t group_local;
  
  if (group == (bsc_group_t)0x0) {
    local_3c = bsp_nprocs();
  }
  else {
    local_3c = *group;
  }
  local_38 = bsc_L(BSC_PUT);
  if (n < local_3c) {
    for (g._0_4_ = 0; (int)g < n; g._0_4_ = (int)g + 1) {
      dVar1 = bsc_g(BSC_PUT,(set[(int)g].size + local_3c + -1) / local_3c);
      local_38 = dVar1 * (double)set[(int)g].size + local_38;
    }
  }
  else {
    for (g._0_4_ = 0; (int)g < n; g._0_4_ = (int)g + 1) {
      dVar1 = bsc_g(BSC_PUT,set[(int)g].size);
      local_38 = dVar1 * (double)set[(int)g].size + local_38;
    }
  }
  return local_38 * 2.0;
}

Assistant:

double bsc_bcast_2phase_costs(  bsc_group_t group,
         bsc_coll_params_t * set, bsc_size_t n )
{
    bsc_size_t i;
    group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs() ;
    double one_phase = bsc_L(BSC_PUT);

    /* Note: the following is only an estimate */

    if ( n < P ) {
        for ( i = 0; i < n ; ++i ) 
            one_phase += bsc_g(BSC_PUT, (set[i].size+P-1)/P) * set[i].size ;
    } else {
        for ( i = 0 ; i < n; ++i )
            one_phase += bsc_g(BSC_PUT, set[i].size) * set[i].size;
    }

    return 2.0 * one_phase;
}